

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::AddFloatsToArraySegment
               (SparseArraySegment<double> *segment,AuxArray<double> *doubles)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  
  uVar1 = doubles->count;
  if ((segment->super_SparseArraySegmentBase).left != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1819,"(segment->left == 0)","segment->left == 0");
    if (!bVar3) goto LAB_009a1de7;
    *puVar5 = 0;
  }
  if ((segment->super_SparseArraySegmentBase).size < uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x181a,"(count <= segment->size)","count <= segment->size");
    if (!bVar3) {
LAB_009a1de7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar4 = (segment->super_SparseArraySegmentBase).length;
  if (uVar4 < uVar1) {
    (segment->super_SparseArraySegmentBase).length = uVar1;
    SparseArraySegmentBase::CheckLengthvsSize(&segment->super_SparseArraySegmentBase);
    uVar4 = (segment->super_SparseArraySegmentBase).length;
  }
  js_memcpy_s(segment + 1,(ulong)uVar4 << 3,doubles + 1,(ulong)uVar1 * 8);
  return;
}

Assistant:

void JavascriptOperators::AddFloatsToArraySegment(SparseArraySegment<double> * segment, const Js::AuxArray<double> *doubles)
    {
        uint32 count = doubles->count;

        Assert(segment->left == 0);
        Assert(count <= segment->size);

        if(count > segment->length)
        {
            segment->length = count;
            segment->CheckLengthvsSize();
        }
        js_memcpy_s(segment->elements, sizeof(double) * segment->length, doubles->elements, sizeof(double) * count);
    }